

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O3

void ImGuiStb::stb_text_makeundo_replace
               (ImGuiTextEditState *str,STB_TexteditState *state,int where,int old_length,
               int new_length)

{
  ImWchar *pIVar1;
  
  pIVar1 = stb_text_createundo(&state->undostate,where,1,1);
  if (pIVar1 != (ImWchar *)0x0) {
    if ((str->Text).Size <= where) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                    ,0x35c,
                    "const value_type &ImVector<unsigned short>::operator[](int) const [T = unsigned short]"
                   );
    }
    *pIVar1 = (str->Text).Data[where];
  }
  return;
}

Assistant:

static void stb_text_makeundo_replace(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int old_length, int new_length)
{
   int i;
   STB_TEXTEDIT_CHARTYPE *p = stb_text_createundo(&state->undostate, where, old_length, new_length);
   if (p) {
      for (i=0; i < old_length; ++i)
         p[i] = STB_TEXTEDIT_GETCHAR(str, where+i);
   }
}